

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncRegister.cpp
# Opt level: O0

void __thiscall
SyncRegister::InitRHS(SyncRegister *this,MultiFab *rhs,Geometry *geom,BCRec *phys_bc)

{
  undefined8 uVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  Box *this_00;
  size_type sVar8;
  reference pvVar9;
  BoxArray *dest;
  MFInfo *info;
  Periodicity *this_01;
  long in_RCX;
  Geometry *in_RDX;
  FabArrayBase *in_RSI;
  long in_RDI;
  Periodicity PVar10;
  OrientationIter face_2;
  MultiFab tmp;
  Real maxcount;
  Array4<double> *mask_1;
  Box *bx_3;
  FArrayBox *fab_2;
  FabSetIter fsi_2;
  FabSet *fs_2;
  OrientationIter face_it_2;
  Box *bhi_1;
  Box *blo_1;
  Array4<double> *fab_arr;
  FArrayBox *fab_1;
  FabSetIter fsi_1;
  FabSet *fs_1;
  OrientationIter face_it_1;
  Box domhi_1;
  Box domlo_1;
  int dir_2;
  Array4<double> *mask;
  Box *bx_1;
  Box *isect;
  int N;
  int is_1;
  IntVect *iv;
  const_iterator End;
  const_iterator it;
  pair<int,_amrex::Box> *is;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *__range3;
  Array4<double> *tmp_arr;
  Elixir tmpfab_i;
  Box result;
  Box mask_cells;
  FArrayBox *fab;
  FabSetIter fsi;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> pshifts;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  FArrayBox tmpfab;
  FabSet *fs;
  OrientationIter face_it;
  OrientationIter face_1;
  Box *bhi;
  Box domhi;
  Box *blo;
  Box domlo;
  Array4<double> *rhs_arr;
  Box *vbx;
  MFIter mfi;
  int dir_1;
  int n;
  Box bx;
  Box *node_domain;
  int dir;
  int nOutflow;
  int outflow_dirs [2];
  int *phys_hi;
  int *phys_lo;
  OrientationIter face;
  int ngrow;
  int i;
  int i_1;
  MFIter *in_stack_ffffffffffffef68;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffef70;
  int in_stack_ffffffffffffef78;
  int in_stack_ffffffffffffef7c;
  MFIter *in_stack_ffffffffffffef80;
  Periodicity *pPVar11;
  MultiFab *in_stack_ffffffffffffef88;
  FabSet *in_stack_ffffffffffffef90;
  int in_stack_ffffffffffffef98;
  undefined4 in_stack_ffffffffffffef9c;
  Geometry *in_stack_ffffffffffffefa0;
  MultiFab *dst;
  BoxArray *in_stack_ffffffffffffefa8;
  BoxArray *in_stack_ffffffffffffefb0;
  anon_class_128_2_b571c7cc *in_stack_ffffffffffffefb8;
  Box *in_stack_ffffffffffffefc0;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *out;
  Array4<double> *this_02;
  Box *target;
  Geometry *this_03;
  Orientation local_f78;
  OrientationIter local_f74;
  undefined1 local_f70 [16];
  Real in_stack_fffffffffffff0a0;
  FabSet *in_stack_fffffffffffff0a8;
  undefined1 local_dc0 [64];
  undefined8 local_d80;
  undefined8 local_d78;
  Array4<double> local_d70;
  Array4<double> *local_d30;
  BoxArray *local_d28;
  BaseFab<double> *local_d20;
  MFIter local_d18;
  Orientation local_cb4;
  long local_cb0;
  OrientationIter local_ca4;
  undefined1 local_ca0 [68];
  undefined1 local_c5c [132];
  Box *local_bd8;
  undefined1 local_bd0 [64];
  undefined1 *local_b90;
  BaseFab<double> *local_b88;
  MFIter local_b80;
  Orientation local_b1c;
  long local_b18;
  OrientationIter local_b10;
  undefined8 local_b0c;
  undefined8 local_b04;
  int iStack_b00;
  undefined8 local_afc;
  uint local_af4;
  undefined8 local_af0;
  undefined8 local_ae8;
  int iStack_ae4;
  undefined8 local_ae0;
  uint local_ad8;
  int local_ad4;
  undefined1 local_ad0 [64];
  undefined1 auStack_a90 [64];
  Array4<double> local_a50;
  Array4<double> *local_a10;
  Box *local_a08;
  undefined1 local_a00 [64];
  Box *local_9c0;
  int local_9b4;
  int local_9b0;
  reference local_990;
  IntVect *local_988;
  IntVect *local_978;
  __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
  local_970;
  undefined1 local_968 [64];
  reference local_928;
  pair<int,_amrex::Box> *local_920;
  __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
  local_918;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *local_910;
  double *local_908;
  Long LStack_900;
  Long local_8f8;
  Long LStack_8f0;
  undefined8 uStack_8e8;
  undefined4 uStack_8e0;
  undefined4 local_8dc;
  undefined4 uStack_8d8;
  undefined8 uStack_8d4;
  Array4<double> local_8c8;
  Array4<double> *local_888;
  undefined1 local_868 [28];
  undefined1 local_84c [24];
  undefined4 local_834;
  BaseFab<double> *local_830;
  MFIter local_828;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_798;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_780 [3];
  Orientation local_734;
  long local_730;
  OrientationIter local_724;
  Orientation local_720;
  OrientationIter local_71c;
  undefined1 local_718 [68];
  Box local_6d4;
  Box *local_6b8;
  undefined8 local_6ac;
  undefined8 local_6a4;
  int iStack_6a0;
  undefined8 local_69c;
  uint local_694;
  undefined1 local_690 [68];
  Box local_64c;
  Box *local_630;
  undefined8 local_624;
  undefined8 local_61c;
  int iStack_618;
  undefined8 local_614;
  uint local_60c;
  undefined1 local_608 [64];
  undefined1 *local_5c8;
  undefined1 local_5bc [28];
  undefined1 *local_5a0;
  MFIter local_598;
  int local_534;
  int local_530;
  Box local_52c;
  Box *local_510;
  int local_508;
  int local_504;
  int local_500 [2];
  long local_4f8;
  long local_4f0;
  IntVect local_4e8;
  undefined1 local_4d4 [12];
  Orientation local_4c8;
  Orientation local_4c4;
  OrientationIter local_4c0;
  int local_4bc;
  long local_4b8;
  Geometry *local_4b0;
  FabArrayBase *local_4a8;
  long local_498;
  long local_490;
  Box *local_488;
  undefined4 local_47c;
  int local_478;
  int local_474;
  undefined8 *local_470;
  undefined4 local_464;
  int local_460;
  int local_45c;
  undefined8 *local_458;
  undefined4 local_44c;
  int local_448;
  int local_444;
  undefined8 *local_440;
  undefined4 local_434;
  int local_430;
  int local_42c;
  undefined8 *local_428;
  undefined1 *local_420;
  undefined4 local_414;
  Box *local_410;
  BaseFab<double> *local_408;
  BaseFab<double> *local_400;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *local_3f8;
  int local_3ec;
  Box *local_3e8;
  int local_3dc;
  IndexType *local_3d8;
  undefined4 local_3d0;
  int local_3cc;
  IntVect *local_3c8;
  IndexType *local_3c0;
  int local_3b4;
  IndexType *local_3b0;
  int local_3a4;
  int local_3a0;
  int local_39c;
  int *local_398;
  int local_390;
  int local_38c;
  undefined8 *local_388;
  int local_380;
  int local_37c;
  int *local_378;
  int local_370;
  int local_36c;
  undefined8 *local_368;
  int local_360;
  int local_35c;
  int *local_358;
  int local_350;
  int local_34c;
  undefined8 *local_348;
  int local_340;
  int local_33c;
  int *local_338;
  int local_330;
  int local_32c;
  undefined8 *local_328;
  int local_31c;
  Geometry *local_318;
  int local_30c;
  undefined4 *local_308;
  undefined4 local_300;
  int local_2fc;
  undefined1 *local_2f8;
  int local_2ec;
  undefined4 *local_2e8;
  int local_2dc;
  undefined4 *local_2d8;
  Dim3 local_2d0;
  Dim3 local_2c0;
  pointer local_2b0;
  int local_2a8;
  pointer local_2a0;
  int local_298;
  int local_294;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *local_290;
  pointer local_288;
  Dim3 local_280;
  Dim3 local_26c;
  Dim3 local_260;
  Dim3 local_250;
  int local_244;
  Box *local_240;
  double *local_238;
  Dim3 local_230;
  Dim3 local_21c;
  Dim3 local_210;
  Dim3 local_200;
  int local_1f4;
  Box *local_1f0;
  double *local_1e8;
  Dim3 local_1e0;
  Box *local_1d0;
  int local_1c8;
  int iStack_1c4;
  int local_1c0;
  undefined4 local_1bc;
  Box *local_1b8;
  undefined4 local_1ac;
  Box *local_1a8;
  undefined4 local_19c;
  Box *local_198;
  Dim3 local_190;
  Box *local_180;
  int local_178;
  int iStack_174;
  int local_170;
  undefined4 local_16c;
  Box *local_168;
  undefined4 local_15c;
  Box *local_158;
  undefined4 local_14c;
  Box *local_148;
  pointer local_140;
  int local_138;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *local_130;
  undefined4 local_128;
  undefined4 uStack_124;
  int local_120;
  undefined4 local_11c;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *local_118;
  undefined4 local_10c;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *local_108;
  undefined4 local_fc;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *local_f8;
  Dim3 local_f0;
  Box *local_e0;
  int local_d8;
  int iStack_d4;
  int local_d0;
  undefined4 local_cc;
  IntVect *local_c8;
  undefined4 local_bc;
  IntVect *local_b8;
  undefined4 local_ac;
  IntVect *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  IntVect *local_78;
  undefined4 local_6c;
  IntVect *local_68;
  undefined4 local_5c;
  IntVect *local_58;
  Dim3 local_50;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  undefined1 *local_28;
  undefined4 local_1c;
  undefined1 *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_4b8 = in_RCX;
  local_4b0 = in_RDX;
  local_4a8 = in_RSI;
  local_4bc = amrex::FabArrayBase::nGrow(in_RSI,0);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (in_stack_ffffffffffffef70,(value_type)in_stack_ffffffffffffef68);
  amrex::OrientationIter::OrientationIter(&local_4c0);
  while (pvVar7 = amrex::OrientationIter::operator_cast_to_void_(&local_4c0), pvVar7 != (void *)0x0)
  {
    local_4c4 = amrex::OrientationIter::operator()((OrientationIter *)in_stack_ffffffffffffef68);
    amrex::Orientation::operator_cast_to_int(&local_4c4);
    local_4c8 = amrex::OrientationIter::operator()((OrientationIter *)in_stack_ffffffffffffef68);
    amrex::Orientation::operator_cast_to_int(&local_4c8);
    amrex::FabSet::nComp((FabSet *)0x48d2da);
    PVar10 = amrex::Geometry::periodicity(in_stack_ffffffffffffefa0);
    local_4e8.vect._0_8_ = PVar10.period.vect._0_8_;
    local_4d4._0_4_ = local_4e8.vect[0];
    local_4d4._4_4_ = local_4e8.vect[1];
    local_4e8.vect[2] = PVar10.period.vect[2];
    local_4d4._8_4_ = local_4e8.vect[2];
    in_stack_ffffffffffffef68 = (MFIter *)local_4d4;
    local_4e8 = PVar10.period.vect;
    amrex::FabSet::copyTo
              (in_stack_ffffffffffffef90,in_stack_ffffffffffffef88,
               (int)((ulong)in_stack_ffffffffffffef80 >> 0x20),(int)in_stack_ffffffffffffef80,
               in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78,
               (Periodicity *)in_stack_ffffffffffffefa0);
    amrex::OrientationIter::operator++(&local_4c0);
  }
  local_498 = local_4b8;
  local_4f0 = local_4b8;
  local_490 = local_4b8;
  local_4f8 = local_4b8 + 0xc;
  local_500[0] = -1;
  local_500[1] = 0;
  local_504 = 0;
  for (local_508 = 0; local_508 < 3; local_508 = local_508 + 1) {
    if ((*(int *)(local_4f0 + (long)local_508 * 4) == 2) ||
       (*(int *)(local_4f8 + (long)local_508 * 4) == 2)) {
      local_500[local_504] = local_508;
      local_504 = local_504 + 1;
    }
  }
  local_488 = amrex::Geometry::Domain(local_4b0);
  local_52c.smallend.vect._0_8_ = *(undefined8 *)(local_488->smallend).vect;
  local_52c._8_8_ = *(undefined8 *)((local_488->smallend).vect + 2);
  local_52c.bigend.vect._4_8_ = *(undefined8 *)((local_488->bigend).vect + 1);
  local_52c.btype.itype = (local_488->btype).itype;
  local_3e8 = &local_52c;
  for (local_3ec = 0; local_3ec < 3; local_3ec = local_3ec + 1) {
    local_3d8 = &local_52c.btype;
    local_3dc = local_3ec;
    local_3b0 = &local_52c.btype;
    local_3b4 = local_3ec;
    local_3a4 = local_3ec;
    if ((local_52c.btype.itype & 1 << ((byte)local_3ec & 0x1f)) == 0) {
      local_3c8 = &local_52c.bigend;
      local_3cc = local_3ec;
      local_3d0 = 1;
      local_3c8->vect[local_3ec] = local_3c8->vect[local_3ec] + 1;
    }
  }
  local_3c0 = &local_52c.btype;
  local_52c.btype.itype = 7;
  local_510 = &local_52c;
  if (0 < local_504) {
    for (local_530 = 0; local_530 < local_504; local_530 = local_530 + 1) {
      local_534 = local_500[local_530];
      amrex::MFIter::MFIter
                ((MFIter *)in_stack_ffffffffffffefa0,
                 (FabArrayBase *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
                 (uchar)((ulong)in_stack_ffffffffffffef90 >> 0x38));
      while (bVar3 = amrex::MFIter::isValid(&local_598), bVar3) {
        amrex::MFIter::validbox(in_stack_ffffffffffffef80);
        local_5a0 = local_5bc;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
                   (MFIter *)in_stack_ffffffffffffef70);
        iVar5 = local_534;
        local_5c8 = local_608;
        if (*(int *)(local_4f0 + (long)local_534 * 4) == 2) {
          local_624 = *(undefined8 *)(local_510->smallend).vect;
          local_61c = *(undefined8 *)((local_510->smallend).vect + 2);
          local_614 = *(undefined8 *)((local_510->bigend).vect + 1);
          local_60c = (local_510->btype).itype;
          iVar4 = amrex::Box::smallEnd(local_510,local_534);
          local_42c = iVar5;
          local_434 = 1;
          local_38c = iVar5;
          *(int *)((long)&local_624 + (long)iVar5 * 4) = iVar4;
          local_39c = iVar5;
          (&iStack_618)[iVar5] = iVar4;
          local_430 = iVar4;
          local_428 = &local_624;
          local_3a0 = iVar4;
          local_398 = &iStack_618;
          local_390 = iVar4;
          local_388 = &local_624;
          amrex::Box::operator&((Box *)in_stack_ffffffffffffef70,(Box *)in_stack_ffffffffffffef68);
          local_630 = &local_64c;
          bVar3 = amrex::Box::ok(local_630);
          if (bVar3) {
            memcpy(local_690,local_5c8,0x3c);
            amrex::
            ParallelFor<SyncRegister::InitRHS(amrex::MultiFab&,amrex::Geometry_const&,amrex::BCRec_const&)::__0>
                      (in_stack_ffffffffffffefc0,
                       (anon_class_64_1_c9d9ceff *)in_stack_ffffffffffffefb8);
          }
        }
        iVar5 = local_534;
        if (*(int *)(local_4f8 + (long)local_534 * 4) == 2) {
          local_6ac = *(undefined8 *)(local_510->smallend).vect;
          local_6a4 = *(undefined8 *)((local_510->smallend).vect + 2);
          local_69c = *(undefined8 *)((local_510->bigend).vect + 1);
          local_694 = (local_510->btype).itype;
          iVar4 = amrex::Box::bigEnd(local_510,local_534);
          local_444 = iVar5;
          local_44c = 1;
          local_36c = iVar5;
          *(int *)((long)&local_6ac + (long)iVar5 * 4) = iVar4;
          local_37c = iVar5;
          (&iStack_6a0)[iVar5] = iVar4;
          local_448 = iVar4;
          local_440 = &local_6ac;
          local_380 = iVar4;
          local_378 = &iStack_6a0;
          local_370 = iVar4;
          local_368 = &local_6ac;
          amrex::Box::operator&((Box *)in_stack_ffffffffffffef70,(Box *)in_stack_ffffffffffffef68);
          local_6b8 = &local_6d4;
          bVar3 = amrex::Box::ok(local_6b8);
          if (bVar3) {
            memcpy(local_718,local_5c8,0x3c);
            amrex::
            ParallelFor<SyncRegister::InitRHS(amrex::MultiFab&,amrex::Geometry_const&,amrex::BCRec_const&)::__1>
                      (in_stack_ffffffffffffefc0,
                       (anon_class_64_1_c9d9ceff *)in_stack_ffffffffffffefb8);
          }
        }
        amrex::MFIter::operator++(&local_598);
      }
      amrex::MFIter::~MFIter((MFIter *)in_stack_ffffffffffffef70);
    }
  }
  amrex::OrientationIter::OrientationIter(&local_71c);
  while (pvVar7 = amrex::OrientationIter::operator_cast_to_void_(&local_71c), pvVar7 != (void *)0x0)
  {
    local_720 = amrex::OrientationIter::operator()((OrientationIter *)in_stack_ffffffffffffef68);
    amrex::Orientation::operator_cast_to_int(&local_720);
    amrex::FabSet::setVal(in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
    amrex::OrientationIter::operator++(&local_71c);
  }
  amrex::OrientationIter::OrientationIter(&local_724);
  while (pvVar7 = amrex::OrientationIter::operator_cast_to_void_(&local_724), pvVar7 != (void *)0x0)
  {
    local_734 = amrex::OrientationIter::operator()((OrientationIter *)in_stack_ffffffffffffef68);
    iVar5 = amrex::Orientation::operator_cast_to_int(&local_734);
    local_730 = in_RDI + 0x970 + (long)iVar5 * 0x180;
    amrex::FArrayBox::FArrayBox((FArrayBox *)in_stack_ffffffffffffef70);
    std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::vector
              ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               0x48db3a);
    std::allocator<amrex::IntVect>::allocator((allocator<amrex::IntVect> *)0x48db4f);
    amrex::Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
              ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_ffffffffffffef70,
               (size_type)in_stack_ffffffffffffef68,(allocator_type *)0x48db69);
    std::allocator<amrex::IntVect>::~allocator((allocator<amrex::IntVect> *)0x48db78);
    amrex::FabSetIter::FabSetIter
              ((FabSetIter *)in_stack_ffffffffffffef70,(FabSet *)in_stack_ffffffffffffef68);
    while (bVar3 = amrex::MFIter::isValid(&local_828), bVar3) {
      local_830 = &amrex::FabSet::operator[]
                             ((FabSet *)in_stack_ffffffffffffef70,in_stack_ffffffffffffef68)->
                   super_BaseFab<double>;
      local_410 = amrex::BaseFab<double>::box(local_830);
      local_414 = 1;
      local_868._0_4_ = (local_410->smallend).vect[0];
      local_868._4_4_ = (local_410->smallend).vect[1];
      local_868._8_8_ = *(undefined8 *)((local_410->smallend).vect + 2);
      local_868._16_8_ = *(undefined8 *)((local_410->bigend).vect + 1);
      local_868._24_4_ = (local_410->btype).itype;
      amrex::Box::grow((Box *)local_868,1);
      local_420 = local_868;
      local_84c._0_8_ = local_868._0_8_;
      local_84c._8_8_ = local_868._8_8_;
      local_84c._16_8_ = local_868._16_8_;
      this_03 = (Geometry *)local_84c;
      for (local_31c = 0; local_31c < 3; local_31c = local_31c + 1) {
        local_308 = &local_834;
        local_30c = local_31c;
        local_2ec = local_31c;
        local_2dc = local_31c;
        if ((local_868._24_4_ & 1 << ((byte)local_31c & 0x1f)) != 0) {
          local_2f8 = local_84c + 0xc;
          local_2fc = local_31c;
          local_300 = 0xffffffff;
          *(int *)(local_2f8 + (long)local_31c * 4) = *(int *)(local_2f8 + (long)local_31c * 4) + -1
          ;
        }
        local_2e8 = local_308;
      }
      local_2d8 = &local_834;
      local_834 = 0;
      local_318 = this_03;
      amrex::FArrayBox::resize
                ((FArrayBox *)in_stack_ffffffffffffef80,
                 (Box *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
                 (int)((ulong)in_stack_ffffffffffffef70 >> 0x20),(Arena *)in_stack_ffffffffffffef68)
      ;
      out = local_780;
      amrex::BaseFab<double>::elixir<double,_0>
                ((BaseFab<double> *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
      local_288 = (out->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      local_290 = out + 1;
      local_294 = *(int *)((long)&out[2].
                                  super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 4);
      local_fc = 0;
      local_128 = *(undefined4 *)
                   &(local_290->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_10c = 1;
      uStack_124 = *(undefined4 *)
                    ((long)&out[1].super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_start + 4);
      local_2b0 = (local_290->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_11c = 2;
      local_2a8 = *(int *)&out[1].super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
      local_8 = (int *)((long)&out[1].super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 4);
      local_c = 0;
      local_38 = *local_8 + 1;
      local_18 = (undefined1 *)
                 ((long)&out[1].super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                         super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl
                         .super__Vector_impl_data._M_finish + 4);
      local_1c = 1;
      iStack_34 = *(int *)&out[1].super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 1;
      local_28 = (undefined1 *)
                 ((long)&out[1].super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                         super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl
                         .super__Vector_impl_data._M_finish + 4);
      local_2c = 2;
      local_2d0.z = *(int *)((long)&out[1].
                                    super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) + 1;
      local_2d0.y = iStack_34;
      local_2d0.x = local_38;
      this_02 = &local_8c8;
      local_3f8 = out;
      local_2c0._0_8_ = local_2d0._0_8_;
      local_2c0.z = local_2d0.z;
      local_2a0 = local_2b0;
      local_298 = local_2a8;
      local_140 = local_2b0;
      local_138 = local_2a8;
      local_130 = local_290;
      local_120 = local_2a8;
      local_118 = local_290;
      local_108 = local_290;
      local_f8 = local_290;
      local_50._0_8_ = local_2d0._0_8_;
      local_50.z = local_2d0.z;
      local_40 = local_290;
      local_30 = local_2d0.z;
      amrex::Array4<double>::Array4
                (this_02,(double *)local_288,(Dim3 *)&local_2a0,&local_2c0,local_294);
      local_908 = this_02->p;
      LStack_900 = this_02->jstride;
      local_8f8 = this_02->kstride;
      LStack_8f0 = this_02->nstride;
      uStack_8e8._0_4_ = (this_02->begin).x;
      uStack_8e8._4_4_ = (this_02->begin).y;
      uVar1 = *(undefined8 *)&(this_02->begin).z;
      uVar2 = (this_02->end).y;
      uStack_8d4 = *(undefined8 *)&(this_02->end).z;
      uStack_8e0 = (undefined4)uVar1;
      local_8dc = (undefined4)((ulong)uVar1 >> 0x20);
      target = (Box *)local_84c;
      uStack_8d8 = uVar2;
      local_888 = this_02;
      amrex::
      ParallelFor<SyncRegister::InitRHS(amrex::MultiFab&,amrex::Geometry_const&,amrex::BCRec_const&)::__2>
                (in_stack_ffffffffffffefc0,(anon_class_64_1_3c043a19 *)in_stack_ffffffffffffefb8);
      amrex::BoxArray::intersections
                (in_stack_ffffffffffffefb0,(Box *)in_stack_ffffffffffffefa8,
                 (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )in_stack_ffffffffffffefa0);
      local_910 = &local_798;
      local_918._M_current =
           (pair<int,_amrex::Box> *)
           std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
           begin((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )in_stack_ffffffffffffef68);
      local_920 = (pair<int,_amrex::Box> *)
                  std::
                  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
                  end((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                       *)in_stack_ffffffffffffef68);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                                 *)in_stack_ffffffffffffef70,
                                (__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                                 *)in_stack_ffffffffffffef68), bVar3) {
        local_928 = __gnu_cxx::
                    __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                    ::operator*(&local_918);
        memcpy(local_968,local_888,0x3c);
        amrex::
        ParallelFor<SyncRegister::InitRHS(amrex::MultiFab&,amrex::Geometry_const&,amrex::BCRec_const&)::__3>
                  (in_stack_ffffffffffffefc0,(anon_class_64_1_3c043a19 *)in_stack_ffffffffffffefb8);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
        ::operator++(&local_918);
      }
      bVar3 = amrex::Geometry::isAnyPeriodic((Geometry *)in_stack_ffffffffffffef70);
      if (bVar3) {
        this_00 = amrex::Geometry::Domain(local_4b0);
        bVar3 = amrex::Box::contains(this_00,(Box *)local_84c);
        if (!bVar3) {
          amrex::Geometry::Domain(local_4b0);
          amrex::Geometry::periodicShift(this_03,target,(Box *)this_02,out);
          local_978 = (IntVect *)
                      std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::begin
                                ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                                 in_stack_ffffffffffffef68);
          __gnu_cxx::
          __normal_iterator<amrex::IntVect_const*,std::vector<amrex::IntVect,std::allocator<amrex::IntVect>>>
          ::__normal_iterator<amrex::IntVect*>
                    ((__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                      *)in_stack_ffffffffffffef70,
                     (__normal_iterator<amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                      *)in_stack_ffffffffffffef68);
          local_988 = (IntVect *)
                      std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::end
                                ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                                 in_stack_ffffffffffffef68);
          __gnu_cxx::
          __normal_iterator<amrex::IntVect_const*,std::vector<amrex::IntVect,std::allocator<amrex::IntVect>>>
          ::__normal_iterator<amrex::IntVect*>
                    ((__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                      *)in_stack_ffffffffffffef70,
                     (__normal_iterator<amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                      *)in_stack_ffffffffffffef68);
          while (bVar3 = __gnu_cxx::operator!=
                                   ((__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                                     *)in_stack_ffffffffffffef70,
                                    (__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                                     *)in_stack_ffffffffffffef68), bVar3) {
            local_990 = __gnu_cxx::
                        __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                        ::operator*(&local_970);
            amrex::Box::operator+
                      ((Box *)in_stack_ffffffffffffef70,(IntVect *)in_stack_ffffffffffffef68);
            amrex::BoxArray::intersections
                      (in_stack_ffffffffffffefb0,(Box *)in_stack_ffffffffffffefa8,
                       (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        *)in_stack_ffffffffffffefa0);
            local_9b0 = 0;
            sVar8 = std::
                    vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ::size(&local_798);
            local_9b4 = (int)sVar8;
            for (; local_9b0 < local_9b4; local_9b0 = local_9b0 + 1) {
              pvVar9 = std::
                       vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                       ::operator[](&local_798,(long)local_9b0);
              local_9c0 = &pvVar9->second;
              amrex::Box::operator-=(local_9c0,local_990);
              memcpy(local_a00,local_888,0x3c);
              amrex::
              ParallelFor<SyncRegister::InitRHS(amrex::MultiFab&,amrex::Geometry_const&,amrex::BCRec_const&)::__4>
                        (in_stack_ffffffffffffefc0,
                         (anon_class_64_1_3c043a19 *)in_stack_ffffffffffffefb8);
            }
            __gnu_cxx::
            __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
            ::operator++(&local_970);
          }
        }
      }
      local_a08 = amrex::BaseFab<double>::box(local_830);
      local_400 = local_830;
      local_238 = local_830->dptr;
      local_240 = &local_830->domain;
      local_244 = local_830->nvar;
      local_14c = 0;
      local_178 = (local_240->smallend).vect[0];
      local_15c = 1;
      iStack_174 = (local_830->domain).smallend.vect[1];
      local_260.x = (local_240->smallend).vect[0];
      local_260.y = (local_240->smallend).vect[1];
      local_16c = 2;
      local_260.z = (local_830->domain).smallend.vect[2];
      local_58 = &(local_830->domain).bigend;
      local_5c = 0;
      local_88 = local_58->vect[0] + 1;
      local_68 = &(local_830->domain).bigend;
      local_6c = 1;
      iStack_84 = (local_830->domain).bigend.vect[1] + 1;
      local_78 = &(local_830->domain).bigend;
      local_7c = 2;
      local_280.z = (local_830->domain).bigend.vect[2] + 1;
      local_280.y = iStack_84;
      local_280.x = local_88;
      local_26c._0_8_ = local_280._0_8_;
      local_26c.z = local_280.z;
      local_250._0_8_ = local_260._0_8_;
      local_250.z = local_260.z;
      local_190._0_8_ = local_260._0_8_;
      local_190.z = local_260.z;
      local_180 = local_240;
      local_170 = local_260.z;
      local_168 = local_240;
      local_158 = local_240;
      local_148 = local_240;
      local_a0._0_8_ = local_280._0_8_;
      local_a0.z = local_280.z;
      local_90 = local_240;
      local_80 = local_280.z;
      amrex::Array4<double>::Array4(&local_a50,local_238,&local_250,&local_26c,local_244);
      local_a10 = &local_a50;
      memcpy(local_ad0,local_a10,0x3c);
      memcpy(auStack_a90,local_888,0x3c);
      amrex::
      ParallelFor<SyncRegister::InitRHS(amrex::MultiFab&,amrex::Geometry_const&,amrex::BCRec_const&)::__5>
                (in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
      amrex::Gpu::Elixir::~Elixir((Elixir *)in_stack_ffffffffffffef70);
      amrex::MFIter::operator++(&local_828);
    }
    amrex::FabSetIter::~FabSetIter((FabSetIter *)0x48dbaf);
    amrex::Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~Vector
              ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)0x48e7bc);
    std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
              ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               in_stack_ffffffffffffef80);
    amrex::FArrayBox::~FArrayBox((FArrayBox *)0x48e7d6);
    amrex::OrientationIter::operator++(&local_724);
  }
  for (local_ad4 = 0; local_ad4 < 3; local_ad4 = local_ad4 + 1) {
    bVar3 = amrex::Geometry::isPeriodic(local_4b0,local_ad4);
    iVar5 = local_ad4;
    if (!bVar3) {
      local_af0 = *(undefined8 *)(local_510->smallend).vect;
      local_ae8 = *(undefined8 *)((local_510->smallend).vect + 2);
      local_ae0 = *(undefined8 *)((local_510->bigend).vect + 1);
      local_ad8 = (local_510->btype).itype;
      local_b0c = *(undefined8 *)(local_510->smallend).vect;
      local_b04 = *(undefined8 *)((local_510->smallend).vect + 2);
      local_afc = *(undefined8 *)((local_510->bigend).vect + 1);
      local_af4 = (local_510->btype).itype;
      iVar6 = amrex::Box::smallEnd(local_510,local_ad4);
      iVar4 = local_ad4;
      local_45c = iVar5;
      local_464 = 1;
      local_34c = iVar5;
      *(int *)((long)&local_af0 + (long)iVar5 * 4) = iVar6;
      local_35c = iVar5;
      (&iStack_ae4)[iVar5] = iVar6;
      local_460 = iVar6;
      local_458 = &local_af0;
      local_360 = iVar6;
      local_358 = &iStack_ae4;
      local_350 = iVar6;
      local_348 = &local_af0;
      iVar5 = amrex::Box::bigEnd(local_510,local_ad4);
      local_474 = iVar4;
      local_47c = 1;
      local_32c = iVar4;
      *(int *)((long)&local_b0c + (long)iVar4 * 4) = iVar5;
      local_33c = iVar4;
      (&iStack_b00)[iVar4] = iVar5;
      local_478 = iVar5;
      local_470 = &local_b0c;
      local_340 = iVar5;
      local_338 = &iStack_b00;
      local_330 = iVar5;
      local_328 = &local_b0c;
      amrex::OrientationIter::OrientationIter(&local_b10);
      while (pvVar7 = amrex::OrientationIter::operator_cast_to_void_(&local_b10),
            pvVar7 != (void *)0x0) {
        local_b1c = amrex::OrientationIter::operator()((OrientationIter *)in_stack_ffffffffffffef68)
        ;
        iVar5 = amrex::Orientation::operator_cast_to_int(&local_b1c);
        local_b18 = in_RDI + 0x970 + (long)iVar5 * 0x180;
        amrex::FabSetIter::FabSetIter
                  ((FabSetIter *)in_stack_ffffffffffffef70,(FabSet *)in_stack_ffffffffffffef68);
        while (bVar3 = amrex::MFIter::isValid(&local_b80), bVar3) {
          local_b88 = &amrex::FabSet::operator[]
                                 ((FabSet *)in_stack_ffffffffffffef70,in_stack_ffffffffffffef68)->
                       super_BaseFab<double>;
          amrex::FabSet::array((FabSet *)in_stack_ffffffffffffef70,in_stack_ffffffffffffef68);
          local_b90 = local_bd0;
          amrex::BaseFab<double>::box(local_b88);
          amrex::Box::operator&((Box *)in_stack_ffffffffffffef70,(Box *)in_stack_ffffffffffffef68);
          local_bd8 = (Box *)(local_c5c + 0x68);
          bVar3 = amrex::Box::ok(local_bd8);
          if (bVar3) {
            in_stack_ffffffffffffefc0 = local_bd8;
            memcpy(local_c5c + 0x24,local_b90,0x3c);
            amrex::
            ParallelFor<SyncRegister::InitRHS(amrex::MultiFab&,amrex::Geometry_const&,amrex::BCRec_const&)::__6>
                      (in_stack_ffffffffffffefc0,
                       (anon_class_64_1_422d8c09 *)in_stack_ffffffffffffefb8);
          }
          amrex::BaseFab<double>::box(local_b88);
          amrex::Box::operator&((Box *)in_stack_ffffffffffffef70,(Box *)in_stack_ffffffffffffef68);
          local_c5c._28_8_ = local_c5c;
          bVar3 = amrex::Box::ok((Box *)local_c5c._28_8_);
          if (bVar3) {
            in_stack_ffffffffffffefb8 = (anon_class_128_2_b571c7cc *)local_c5c._28_8_;
            memcpy(local_ca0,local_b90,0x3c);
            amrex::
            ParallelFor<SyncRegister::InitRHS(amrex::MultiFab&,amrex::Geometry_const&,amrex::BCRec_const&)::__7>
                      (in_stack_ffffffffffffefc0,
                       (anon_class_64_1_422d8c09 *)in_stack_ffffffffffffefb8);
          }
          amrex::MFIter::operator++(&local_b80);
        }
        amrex::FabSetIter::~FabSetIter((FabSetIter *)0x48eb16);
        amrex::OrientationIter::operator++(&local_b10);
      }
    }
  }
  amrex::OrientationIter::OrientationIter(&local_ca4);
  while (pvVar7 = amrex::OrientationIter::operator_cast_to_void_(&local_ca4), pvVar7 != (void *)0x0)
  {
    in_stack_ffffffffffffefb0 = (BoxArray *)(in_RDI + 0x970);
    local_cb4 = amrex::OrientationIter::operator()((OrientationIter *)in_stack_ffffffffffffef68);
    iVar5 = amrex::Orientation::operator_cast_to_int(&local_cb4);
    local_cb0 = (long)in_stack_ffffffffffffefb0 + (long)iVar5 * 0x180;
    amrex::FabSetIter::FabSetIter
              ((FabSetIter *)in_stack_ffffffffffffef70,(FabSet *)in_stack_ffffffffffffef68);
    while (bVar3 = amrex::MFIter::isValid(&local_d18), bVar3) {
      local_d20 = &amrex::FabSet::operator[]
                             ((FabSet *)in_stack_ffffffffffffef70,in_stack_ffffffffffffef68)->
                   super_BaseFab<double>;
      local_d28 = (BoxArray *)amrex::BaseFab<double>::box(local_d20);
      local_408 = local_d20;
      local_1e8 = local_d20->dptr;
      local_1f0 = &local_d20->domain;
      local_1f4 = local_d20->nvar;
      local_19c = 0;
      local_1c8 = (local_1f0->smallend).vect[0];
      local_1ac = 1;
      iStack_1c4 = (local_d20->domain).smallend.vect[1];
      local_210.x = (local_1f0->smallend).vect[0];
      local_210.y = (local_1f0->smallend).vect[1];
      local_1bc = 2;
      local_210.z = (local_d20->domain).smallend.vect[2];
      local_a8 = &(local_d20->domain).bigend;
      local_ac = 0;
      local_d8 = local_a8->vect[0] + 1;
      local_b8 = &(local_d20->domain).bigend;
      local_bc = 1;
      iStack_d4 = (local_d20->domain).bigend.vect[1] + 1;
      local_c8 = &(local_d20->domain).bigend;
      local_cc = 2;
      local_230.z = (local_d20->domain).bigend.vect[2] + 1;
      local_230.y = iStack_d4;
      local_230.x = local_d8;
      local_21c._0_8_ = local_230._0_8_;
      local_21c.z = local_230.z;
      local_200._0_8_ = local_210._0_8_;
      local_200.z = local_210.z;
      local_1e0._0_8_ = local_210._0_8_;
      local_1e0.z = local_210.z;
      local_1d0 = local_1f0;
      local_1c0 = local_210.z;
      local_1b8 = local_1f0;
      local_1a8 = local_1f0;
      local_198 = local_1f0;
      local_f0._0_8_ = local_230._0_8_;
      local_f0.z = local_230.z;
      local_e0 = local_1f0;
      local_d0 = local_230.z;
      amrex::Array4<double>::Array4(&local_d70,local_1e8,&local_200,&local_21c,local_1f4);
      local_d30 = &local_d70;
      local_d78 = 0x403a800000000000;
      in_stack_ffffffffffffefa8 = local_d28;
      memcpy(local_dc0,local_d30,0x3c);
      local_d80 = 0x403a800000000000;
      amrex::
      ParallelFor<SyncRegister::InitRHS(amrex::MultiFab&,amrex::Geometry_const&,amrex::BCRec_const&)::__8>
                (in_stack_ffffffffffffefc0,(anon_class_72_2_fc5023e4 *)in_stack_ffffffffffffefb8);
      amrex::MFIter::operator++(&local_d18);
    }
    amrex::FabSetIter::~FabSetIter((FabSetIter *)0x48ed50);
    amrex::OrientationIter::operator++(&local_ca4);
  }
  dest = amrex::FabArrayBase::boxArray(local_4a8);
  info = (MFInfo *)amrex::FabArrayBase::DistributionMap(local_4a8);
  local_f70._8_8_ = 0;
  dst = (MultiFab *)(local_f70 + 8);
  iVar5 = local_4bc;
  amrex::MFInfo::MFInfo((MFInfo *)0x48f106);
  local_f70._0_4_ = 0;
  local_f70._4_4_ = 0;
  this_01 = (Periodicity *)local_f70;
  amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffef70);
  pPVar11 = this_01;
  amrex::MultiFab::MultiFab
            ((MultiFab *)in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8,
             (DistributionMapping *)dst,iVar5,in_stack_ffffffffffffef98,info,
             (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffefc0);
  amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x48f164);
  amrex::MFInfo::~MFInfo((MFInfo *)0x48f171);
  amrex::OrientationIter::OrientationIter(&local_f74);
  while (pvVar7 = amrex::OrientationIter::operator_cast_to_void_(&local_f74), pvVar7 != (void *)0x0)
  {
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffef70,(value_type)this_01);
    local_f78 = amrex::OrientationIter::operator()((OrientationIter *)this_01);
    iVar4 = amrex::Orientation::operator_cast_to_int(&local_f78);
    in_stack_ffffffffffffef70 = (FabArray<amrex::FArrayBox> *)(in_RDI + 0x970 + (long)iVar4 * 0x180)
    ;
    iVar4 = local_4bc;
    this_01 = amrex::Periodicity::NonPeriodic();
    amrex::FabSet::copyTo
              ((FabSet *)info,(MultiFab *)dest,(int)((ulong)pPVar11 >> 0x20),(int)pPVar11,iVar4,
               in_stack_ffffffffffffef78,(Periodicity *)dst);
    amrex::MultiFab::Multiply
              (dst,(MultiFab *)CONCAT44(iVar5,in_stack_ffffffffffffef98),(int)((ulong)info >> 0x20),
               (int)info,(int)((ulong)dest >> 0x20),(int)dest);
    amrex::OrientationIter::operator++(&local_f74);
  }
  amrex::MultiFab::~MultiFab((MultiFab *)0x48f2c9);
  return;
}

Assistant:

void /* note that rhs is on a different BoxArray */
SyncRegister::InitRHS (MultiFab& rhs, const Geometry& geom, const BCRec& phys_bc)
{
    BL_PROFILE("SyncRegister::InitRHS()");

    BL_ASSERT(rhs.nComp() == 1);
 
    int ngrow = rhs.nGrow();

    rhs.setVal(0);

    for (OrientationIter face; face; ++face)
    {
        bndry[face()].copyTo(rhs,ngrow,0,0,bndry[face()].nComp(),geom.periodicity());
    }

    const int* phys_lo = phys_bc.lo();
    const int* phys_hi = phys_bc.hi();

    int outflow_dirs[AMREX_SPACEDIM-1]={-1};
    int nOutflow = 0;
    for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
    {
      if (phys_lo[dir] == Outflow || phys_hi[dir] == Outflow)
      {
         outflow_dirs[nOutflow]=dir;
         nOutflow++;
      }
    }

    const Box& node_domain = amrex::surroundingNodes(geom.Domain());

    if (nOutflow > 0)
    {      
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
      for (int n = 0; n < nOutflow; n++)
      {
         int dir = outflow_dirs[n];

         for (MFIter mfi(rhs); mfi.isValid(); ++mfi)
         {
           const Box& vbx = mfi.validbox();
           auto const& rhs_arr = rhs.array(mfi);

           if (phys_lo[dir] == Outflow)
           {
             Box domlo(node_domain);
             domlo.setRange(dir,node_domain.smallEnd(dir),1);
             const Box& blo = vbx & domlo;

             if (blo.ok()) {
               amrex::ParallelFor(blo, [rhs_arr]
               AMREX_GPU_DEVICE (int i, int j, int k) noexcept
               {
                  rhs_arr(i,j,k) = 0.0;
               });
             }  
           }
           if (phys_hi[dir] == Outflow)
           {
             Box domhi(node_domain);
             domhi.setRange(dir,node_domain.bigEnd(dir),1);
             const Box& bhi = vbx & domhi;
             if (bhi.ok()) {
               amrex::ParallelFor(bhi, [rhs_arr]
               AMREX_GPU_DEVICE (int i, int j, int k) noexcept
               {
                  rhs_arr(i,j,k) = 0.0;
               });
             }  
           }
         }
      }
    }

    //
    // Set Up bndry_mask.
    //
    for (OrientationIter face; face; ++face)
    {
        bndry_mask[face()].setVal(0);
    }
    
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
       for (OrientationIter face_it; face_it; ++face_it)
       {
          FabSet& fs = bndry_mask[face_it()];

          FArrayBox tmpfab;
          std::vector< std::pair<int,Box> > isects;	    
          Vector<IntVect> pshifts(26);

          for (FabSetIter fsi(fs); fsi.isValid(); ++fsi)
          {
             FArrayBox& fab = fs[fsi];
             Box mask_cells = amrex::enclosedCells(amrex::grow(fab.box(),1));

             tmpfab.resize(mask_cells,1);
             Elixir tmpfab_i = tmpfab.elixir();
             const auto& tmp_arr = tmpfab.array();
             amrex::ParallelFor(mask_cells, [tmp_arr]
             AMREX_GPU_DEVICE (int i, int j, int k) noexcept
             {
                  tmp_arr(i,j,k) = 0.0;
             });

             grids.intersections(mask_cells,isects);
	     
	     for (const auto& is : isects)
             {
                amrex::ParallelFor(is.second, [tmp_arr]
                AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                     tmp_arr(i,j,k) = 1.0;
                });
             }

             if (geom.isAnyPeriodic() && !geom.Domain().contains(mask_cells))
             {
                geom.periodicShift(geom.Domain(),mask_cells,pshifts);

                for (Vector<IntVect>::const_iterator it = pshifts.begin(), End = pshifts.end(); it != End; ++it)
                {
                   const IntVect& iv = *it;

                   grids.intersections(mask_cells+iv,isects);

                   for (int is = 0, N = isects.size(); is < N; is++)
                   {
                      Box& isect = isects[is].second;
                      isect     -= iv;
                      amrex::ParallelFor(isect, [tmp_arr]
                      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                      {
                           tmp_arr(i,j,k) = 1.0;
                      });
                   }
                }
             }
             const Box& bx = fab.box();
             auto const& mask = fab.array();  
             amrex::ParallelFor(bx, [mask,tmp_arr]
             AMREX_GPU_DEVICE (int i, int j, int k) noexcept
             {
                  mask(i,j,k) = D_TERM(  tmp_arr(i  ,j  ,k  ) + tmp_arr(i-1,j  ,k  ),
                                       + tmp_arr(i  ,j-1,k  ) + tmp_arr(i-1,j-1,k  ),
                                       + tmp_arr(i  ,j  ,k-1) + tmp_arr(i-1,j  ,k-1)
                                       + tmp_arr(i  ,j-1,k-1) + tmp_arr(i-1,j-1,k-1));
             });
          }
       }
    }

    //
    // Here double the cell contributions if at a non-periodic physical bdry.
    //
    for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
    {
        if (!geom.isPeriodic(dir))
        {
            Box domlo(node_domain), domhi(node_domain);

            domlo.setRange(dir,node_domain.smallEnd(dir),1);
            domhi.setRange(dir,node_domain.bigEnd(dir),1);

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (OrientationIter face_it; face_it; ++face_it)
            {
                FabSet& fs = bndry_mask[face_it()];

                for (FabSetIter fsi(fs); fsi.isValid(); ++fsi)
                {
                    FArrayBox& fab = fs[fsi];
                    auto const& fab_arr = fs.array(fsi);

                    const Box& blo = fab.box() & domlo;

                    if (blo.ok()) {
                      amrex::ParallelFor(blo, [fab_arr]
                      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                      {
                         fab_arr(i,j,k) *= 2.0;
                      });
                    }

                    const Box& bhi = fab.box() & domhi;

                    if (bhi.ok()) {
                      amrex::ParallelFor(bhi, [fab_arr]
                      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                      {
                         fab_arr(i,j,k) *= 2.0;
                      });
                    }
                }
            }
        }
    }
    //
    // Here convert from sum of cell contributions to 0 or 1.
    //
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (OrientationIter face_it; face_it; ++face_it)
    {
        FabSet& fs = bndry_mask[face_it()];

        for (FabSetIter fsi(fs); fsi.isValid(); ++fsi)
        {
            FArrayBox& fab   = fs[fsi];
            const Box& bx    = fab.box();
            auto const& mask = fab.array();   
            const Real maxcount = D_TERM(AMREX_SPACEDIM,*AMREX_SPACEDIM,*AMREX_SPACEDIM) - 0.5;
            amrex::ParallelFor(bx, [mask,maxcount]
            AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
               mask(i,j,k) = (mask(i,j,k) > maxcount) ? 0.0 : 1.0;
            });
        }
    }

    // Multiply by Bndry Mask

    MultiFab tmp(rhs.boxArray(), rhs.DistributionMap(), 1, ngrow);

    for (OrientationIter face; face; ++face)
    {
        BL_ASSERT(bndry_mask[face()].nComp() == 1);
        tmp.setVal(1.0);
        bndry_mask[face()].copyTo(tmp, ngrow, 0, 0, 1);
        MultiFab::Multiply(rhs, tmp, 0, 0, 1, ngrow);
    }
}